

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tigger_gen.cpp
# Opt level: O0

shared_ptr<tg_program> tigger_gen(shared_ptr<ee_program> *eeprog)

{
  bool bVar1;
  element_type *peVar2;
  optional<int> *poVar3;
  mapped_type *pmVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  __shared_ptr_access<ee_program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RSI;
  shared_ptr<tg_program> sVar7;
  tg_funcdef local_f8;
  ee_funcdef *local_b8;
  ee_funcdef *funcdef;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ee_funcdef,_std::allocator<ee_funcdef>_> *__range1_1;
  value_type local_84;
  reference local_78;
  ee_decl *decl;
  iterator __end1;
  iterator __begin1;
  vector<ee_decl,_std::allocator<ee_decl>_> *__range1;
  unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
  global_decl_map;
  shared_ptr<ee_program> *eeprog_local;
  shared_ptr<tg_program> *ret;
  
  global_decl_map._M_h._M_single_bucket._7_1_ = 0;
  std::make_shared<tg_program>();
  std::
  unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
  ::unordered_map((unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
                   *)&__range1);
  peVar2 = std::__shared_ptr_access<ee_program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RSI);
  __end1 = std::vector<ee_decl,_std::allocator<ee_decl>_>::begin(&peVar2->decls);
  decl = (ee_decl *)std::vector<ee_decl,_std::allocator<ee_decl>_>::end(&peVar2->decls);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ee_decl_*,_std::vector<ee_decl,_std::allocator<ee_decl>_>_>
                                *)&decl);
    if (!bVar1) {
      peVar2 = std::__shared_ptr_access<ee_program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RSI);
      __end1_1 = std::vector<ee_funcdef,_std::allocator<ee_funcdef>_>::begin(&peVar2->funcdefs);
      funcdef = (ee_funcdef *)
                std::vector<ee_funcdef,_std::allocator<ee_funcdef>_>::end(&peVar2->funcdefs);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<ee_funcdef_*,_std::vector<ee_funcdef,_std::allocator<ee_funcdef>_>_>
                            *)&funcdef);
        if (!bVar1) break;
        local_b8 = __gnu_cxx::
                   __normal_iterator<ee_funcdef_*,_std::vector<ee_funcdef,_std::allocator<ee_funcdef>_>_>
                   ::operator*(&__end1_1);
        peVar5 = std::__shared_ptr_access<tg_program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<tg_program,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)eeprog);
        tigger_func_gen(&local_f8,local_b8,
                        (unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
                         *)&__range1);
        std::vector<tg_funcdef,_std::allocator<tg_funcdef>_>::push_back(&peVar5->funcdefs,&local_f8)
        ;
        tg_funcdef::~tg_funcdef(&local_f8);
        __gnu_cxx::
        __normal_iterator<ee_funcdef_*,_std::vector<ee_funcdef,_std::allocator<ee_funcdef>_>_>::
        operator++(&__end1_1);
      }
      global_decl_map._M_h._M_single_bucket._7_1_ = 1;
      std::
      unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
      ::~unordered_map((unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
                        *)&__range1);
      _Var6._M_pi = extraout_RDX;
      if ((global_decl_map._M_h._M_single_bucket._7_1_ & 1) == 0) {
        std::shared_ptr<tg_program>::~shared_ptr((shared_ptr<tg_program> *)eeprog);
        _Var6._M_pi = extraout_RDX_00;
      }
      sVar7.super___shared_ptr<tg_program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var6._M_pi;
      sVar7.super___shared_ptr<tg_program,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)eeprog;
      return (shared_ptr<tg_program>)
             sVar7.super___shared_ptr<tg_program,_(__gnu_cxx::_Lock_policy)2>;
    }
    local_78 = __gnu_cxx::
               __normal_iterator<ee_decl_*,_std::vector<ee_decl,_std::allocator<ee_decl>_>_>::
               operator*(&__end1);
    if ((local_78->sym).type != 'T') break;
    peVar5 = std::__shared_ptr_access<tg_program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<tg_program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )eeprog);
    local_84.vid = (local_78->sym).id;
    local_84.sz.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
         *(_Optional_base<int,_true,_true> *)
          &(local_78->size).super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>;
    std::vector<tg_global_decl,_std::allocator<tg_global_decl>_>::push_back
              (&peVar5->decls,&local_84);
    poVar3 = &local_78->size;
    pmVar4 = std::
             unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
             ::operator[]((unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
                           *)&__range1,&(local_78->sym).id);
    (pmVar4->super__Optional_base<int,_true,_true>)._M_payload.super__Optional_payload_base<int> =
         (poVar3->super__Optional_base<int,_true,_true>)._M_payload.
         super__Optional_payload_base<int>;
    __gnu_cxx::__normal_iterator<ee_decl_*,_std::vector<ee_decl,_std::allocator<ee_decl>_>_>::
    operator++(&__end1);
  }
  __assert_fail("decl.sym.type == \'T\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/tigger_gen.cpp"
                ,0x2b2,"std::shared_ptr<tg_program> tigger_gen(std::shared_ptr<ee_program>)");
}

Assistant:

std::shared_ptr<tg_program> tigger_gen(std::shared_ptr<ee_program> eeprog) {
  std::shared_ptr<tg_program> ret = std::make_shared<tg_program>();
  std::unordered_map<int, std::optional<int>> global_decl_map;
  // decl
  for(const auto &decl: eeprog->decls) {
    assert(decl.sym.type == 'T');
    ret->decls.push_back(tg_global_decl{decl.sym.id, decl.size});
    global_decl_map[decl.sym.id] = decl.size;
  }
  // funcdefs
  for(const auto &funcdef: eeprog->funcdefs) {
    ret->funcdefs.push_back(tigger_func_gen(funcdef, global_decl_map));
  }
  return ret;
}